

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::SkipFallback
          (EpsCopyInputStream *this,char *ptr,int size)

{
  char *pcVar1;
  anon_class_1_0_00000001 local_1d;
  int local_1c;
  char *pcStack_18;
  int size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  local_1c = size;
  pcStack_18 = ptr;
  ptr_local = (char *)this;
  pcVar1 = AppendSize<google::protobuf::internal::EpsCopyInputStream::SkipFallback(char_const*,int)::__0>
                     (this,ptr,size,&local_1d);
  return pcVar1;
}

Assistant:

const char* EpsCopyInputStream::SkipFallback(const char* ptr, int size) {
  return AppendSize(ptr, size, [](const char* /*p*/, int /*s*/) {});
}